

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O2

void fetch_radial_gradient(uint32_t *buffer,Operator *op,VSpanData *data,int y,int x,int length)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint32_t uVar9;
  uint32_t *puVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  fVar15 = (op->field_4).radial.a;
  if (ABS(fVar15) <= 1e-06) {
    memfill32(buffer,0,length);
    return;
  }
  fVar12 = (float)y + 0.5;
  fVar14 = (float)x + 0.5;
  uVar1 = data->m21;
  uVar5 = data->m22;
  uVar2 = data->dx;
  uVar6 = data->dy;
  uVar3 = data->m11;
  uVar7 = data->m12;
  fVar16 = fVar14 * (float)uVar3 + fVar12 * (float)uVar1 + (float)uVar2;
  fVar17 = fVar14 * (float)uVar7 + fVar12 * (float)uVar5 + (float)uVar6;
  fVar11 = data->m13;
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    puVar10 = buffer + length;
    fVar13 = data->m23;
  }
  else {
    fVar13 = data->m23;
    puVar10 = buffer + length;
    if ((fVar13 == 0.0) && (!NAN(fVar13))) {
      fVar16 = fVar16 - (data->mGradient).field_1.linear.x2;
      fVar17 = fVar17 - (data->mGradient).field_1.linear.y2;
      fVar14 = 1.0 / (fVar15 + fVar15);
      fVar11 = (op->field_4).linear.dx;
      fVar12 = (op->field_4).linear.dy;
      fVar18 = fVar17 * fVar12 +
               (op->field_4).linear.l * (data->mGradient).field_1.radial.fradius + fVar16 * fVar11;
      fVar18 = fVar18 + fVar18;
      fVar13 = fVar11 * (float)uVar3 + fVar12 * (float)uVar7;
      fVar13 = fVar13 + fVar13;
      fVar19 = fVar18 * fVar14;
      fVar11 = (float)uVar3 * (float)uVar3 + (float)uVar7 * (float)uVar7;
      fVar20 = (float)uVar7 * fVar17 + fVar16 * (float)uVar3;
      fVar12 = fVar14 * fVar14;
      fVar15 = fVar15 * 4.0;
      fVar17 = (fVar18 * fVar18 -
               ((op->field_4).linear.off - (fVar16 * fVar16 + fVar17 * fVar17)) * fVar15) * fVar12;
      fVar16 = ((fVar20 + fVar20 + fVar11) * fVar15 + fVar13 * (fVar18 + fVar18) + fVar13 * fVar13)
               * fVar12;
      fVar12 = (fVar15 * (fVar11 + fVar11) + (fVar13 + fVar13) * fVar13) * fVar12;
      if ((op->field_4).radial.extended != false) {
        for (; buffer < puVar10; buffer = buffer + 1) {
          uVar9 = 0;
          if (fVar17 >= 0.0) {
            if (fVar17 < 0.0) {
              fVar15 = sqrtf(fVar17);
            }
            else {
              fVar15 = SQRT(fVar17);
            }
            if (0.0 <= (op->field_4).linear.l * (fVar15 - fVar19) +
                       (data->mGradient).field_1.radial.fradius) {
              uVar9 = gradientPixel(&data->mGradient,fVar15 - fVar19);
            }
          }
          *buffer = uVar9;
          fVar17 = fVar17 + fVar16;
          fVar16 = fVar16 + fVar12;
          fVar19 = fVar19 + fVar13 * fVar14;
        }
        return;
      }
      for (; buffer < puVar10; buffer = buffer + 1) {
        if (fVar17 < 0.0) {
          fVar15 = sqrtf(fVar17);
        }
        else {
          fVar15 = SQRT(fVar17);
        }
        uVar9 = gradientPixel(&data->mGradient,fVar15 - fVar19);
        *buffer = uVar9;
        fVar17 = fVar17 + fVar16;
        fVar16 = fVar16 + fVar12;
        fVar19 = fVar19 + fVar13 * fVar14;
      }
      return;
    }
  }
  fVar15 = fVar11 * fVar14 + fVar13 * fVar12 + data->m33;
  for (; buffer < puVar10; buffer = buffer + 1) {
    uVar9 = 0;
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      fVar11 = fVar16 * (1.0 / fVar15) - (data->mGradient).field_1.linear.x2;
      fVar12 = fVar17 * (1.0 / fVar15) - (data->mGradient).field_1.linear.y2;
      fVar14 = (op->field_4).linear.dy * fVar12 +
               (op->field_4).linear.l * (data->mGradient).field_1.radial.fradius +
               (op->field_4).linear.dx * fVar11;
      fVar14 = fVar14 + fVar14;
      fVar11 = fVar14 * fVar14 +
               (op->field_4).radial.a * -4.0 *
               ((op->field_4).linear.off - (fVar11 * fVar11 + fVar12 * fVar12));
      if (fVar11 >= 0.0) {
        if (fVar11 < 0.0) {
          fVar11 = sqrtf(fVar11);
        }
        else {
          fVar11 = SQRT(fVar11);
        }
        fVar12 = (op->field_4).radial.inv2a;
        fVar13 = (-fVar14 - fVar11) * fVar12;
        fVar12 = (fVar11 - fVar14) * fVar12;
        if (fVar12 <= fVar13) {
          fVar12 = fVar13;
        }
        uVar9 = 0;
        if (0.0 <= (op->field_4).linear.l * fVar12 + (data->mGradient).field_1.radial.fradius) {
          uVar9 = gradientPixel(&data->mGradient,fVar12);
        }
      }
    }
    *buffer = uVar9;
    uVar4 = data->m11;
    uVar8 = data->m12;
    fVar16 = fVar16 + (float)uVar4;
    fVar17 = fVar17 + (float)uVar8;
    fVar15 = fVar15 + data->m13;
  }
  return;
}

Assistant:

void fetch_radial_gradient(uint32_t *buffer, const Operator *op,
                           const VSpanData *data, int y, int x, int length)
{
    // avoid division by zero
    if (vIsZero(op->radial.a)) {
        memfill32(buffer, 0, length);
        return;
    }

    float rx =
        data->m21 * (y + float(0.5)) + data->dx + data->m11 * (x + float(0.5));
    float ry =
        data->m22 * (y + float(0.5)) + data->dy + data->m12 * (x + float(0.5));
    bool affine = !data->m13 && !data->m23;

    uint32_t *end = buffer + length;
    if (affine) {
        rx -= data->mGradient.radial.fx;
        ry -= data->mGradient.radial.fy;

        float inv_a = 1 / float(2 * op->radial.a);

        const float delta_rx = data->m11;
        const float delta_ry = data->m12;

        float b = 2 * (op->radial.dr * data->mGradient.radial.fradius +
                       rx * op->radial.dx + ry * op->radial.dy);
        float delta_b =
            2 * (delta_rx * op->radial.dx + delta_ry * op->radial.dy);
        const float b_delta_b = 2 * b * delta_b;
        const float delta_b_delta_b = 2 * delta_b * delta_b;

        const float bb = b * b;
        const float delta_bb = delta_b * delta_b;

        b *= inv_a;
        delta_b *= inv_a;

        const float rxrxryry = rx * rx + ry * ry;
        const float delta_rxrxryry = delta_rx * delta_rx + delta_ry * delta_ry;
        const float rx_plus_ry = 2 * (rx * delta_rx + ry * delta_ry);
        const float delta_rx_plus_ry = 2 * delta_rxrxryry;

        inv_a *= inv_a;

        float det =
            (bb - 4 * op->radial.a * (op->radial.sqrfr - rxrxryry)) * inv_a;
        float delta_det = (b_delta_b + delta_bb +
                           4 * op->radial.a * (rx_plus_ry + delta_rxrxryry)) *
                          inv_a;
        const float delta_delta_det =
            (delta_b_delta_b + 4 * op->radial.a * delta_rx_plus_ry) * inv_a;

        fetch(buffer, end, op, data, det, delta_det, delta_delta_det, b,
              delta_b);
    } else {
        float rw = data->m23 * (y + float(0.5)) + data->m33 +
                   data->m13 * (x + float(0.5));

        while (buffer < end) {
            if (rw == 0) {
                *buffer = 0;
            } else {
                float invRw = 1 / rw;
                float gx = rx * invRw - data->mGradient.radial.fx;
                float gy = ry * invRw - data->mGradient.radial.fy;
                float b = 2 * (op->radial.dr * data->mGradient.radial.fradius +
                               gx * op->radial.dx + gy * op->radial.dy);
                float det = radialDeterminant(
                    op->radial.a, b, op->radial.sqrfr - (gx * gx + gy * gy));

                uint32_t result = 0;
                if (det >= 0) {
                    float detSqrt = std::sqrt(det);

                    float s0 = (-b - detSqrt) * op->radial.inv2a;
                    float s1 = (-b + detSqrt) * op->radial.inv2a;

                    float s = vMax(s0, s1);

                    if (data->mGradient.radial.fradius + op->radial.dr * s >= 0)
                        result = gradientPixel(&data->mGradient, s);
                }

                *buffer = result;
            }

            rx += data->m11;
            ry += data->m12;
            rw += data->m13;

            ++buffer;
        }
    }
}